

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 扑克牌比大小.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  int compare;
  int label2;
  int label1;
  string poker2;
  string poker1;
  int pos;
  string str;
  int in_stack_000002c4;
  string *in_stack_000002c8;
  int in_stack_000002d4;
  string *in_stack_000002d8;
  string *poker;
  string local_108 [32];
  string local_e8 [36];
  int local_c4;
  string local_c0 [32];
  string local_a0 [32];
  int local_80;
  int local_7c;
  string local_78 [32];
  string local_58 [32];
  undefined4 local_38;
  string local_28 [36];
  int local_4;
  
  local_4 = 0;
  std::__cxx11::string::string(local_28);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,local_28);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    poker = local_28;
    local_38 = std::__cxx11::string::find((char)poker,0x2d);
    std::__cxx11::string::substr((ulong)local_58,(ulong)poker);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_78,(ulong)local_28);
    std::__cxx11::string::string(local_a0,local_58);
    local_7c = check_style((string *)poker);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::string(local_c0,local_78);
    local_80 = check_style((string *)poker);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::string(local_e8,local_58);
    std::__cxx11::string::string(local_108,local_78);
    iVar2 = poker_compare(in_stack_000002d8,in_stack_000002d4,in_stack_000002c8,in_stack_000002c4);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
    local_c4 = iVar2;
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,local_78);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else if (iVar2 == 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,local_58);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"ERROR");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_28);
  return local_4;
}

Assistant:

int main()
{
    string str;
    while (getline(cin,str))
    {
        int pos=str.find('-');
        string poker1=str.substr(0,pos);
        string poker2=str.substr(pos+1,str.size()-pos+1);
        int label1,label2;
        label1 = check_style(poker1);
        label2 = check_style(poker2);
        int compare = poker_compare(poker1,label1,poker2,label2);
        if (compare==0)
            cout<<poker2<<endl;
        else if (compare==1)
            cout<<poker1<<endl;
        else
            cout<<"ERROR"<<endl;
    }
    return 0;
}